

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ConBndWriter>
          (NLFeeder_Easy *this,ConBndWriter *cbw)

{
  AlgConRange acr;
  NLModel *pNVar1;
  double *pdVar2;
  NLFeeder_Easy *in_RDI;
  AlgConRange bnd;
  int j;
  AlgConRange local_30;
  int local_14;
  
  for (local_14 = 0;
      local_14 < (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons;
      local_14 = local_14 + 1) {
    NLFeeder<mp::NLFeeder_Easy,_void_*>::AlgConRange::AlgConRange(&local_30);
    pNVar1 = NLME(in_RDI);
    pdVar2 = NLModel::RowLowerBounds(pNVar1);
    local_30.L = pdVar2[local_14];
    pNVar1 = NLME(in_RDI);
    pdVar2 = NLModel::RowUpperBounds(pNVar1);
    local_30.U = pdVar2[local_14];
    acr.U = local_30.L;
    acr.L = (double)in_RDI;
    acr._16_8_ = local_30.U;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::ConBndWriter::
    WriteAlgConRange<mp::NLFeeder<mp::NLFeeder_Easy,void*>::AlgConRange>
              ((ConBndWriter *)local_30.U,acr);
  }
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& cbw) {
    for (int j=0; j<header_.num_algebraic_cons; j++) {
      AlgConRange bnd;
      bnd.L = NLME().RowLowerBounds()[j];
      bnd.U = NLME().RowUpperBounds()[j];
      cbw.WriteAlgConRange(bnd);
    }
  }